

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,float fZFar,bool directX)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Matrix4f *projection;
  undefined1 auVar6 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar8 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar9 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar10 [64];
  
  auVar10._4_60_ = in_register_000012c4;
  auVar10._0_4_ = fTop;
  auVar9._4_60_ = in_register_00001284;
  auVar9._0_4_ = fBottom;
  auVar8._4_60_ = in_register_00001244;
  auVar8._0_4_ = fRight;
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = fLeft;
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  fVar2 = fZNear + fZNear;
  auVar3 = vinsertps_avx(auVar8._0_16_,auVar10._0_16_,0x10);
  auVar4 = vinsertps_avx(auVar7._0_16_,auVar9._0_16_,0x10);
  auVar5 = vsubps_avx(auVar3,auVar4);
  __return_storage_ptr__->m_elements[0] = fVar2 / auVar5._0_4_;
  auVar6 = vmovshdup_avx(auVar5);
  __return_storage_ptr__->m_elements[5] = fVar2 / auVar6._0_4_;
  auVar6._0_4_ = auVar4._0_4_ + auVar3._0_4_;
  auVar6._4_4_ = auVar4._4_4_ + auVar3._4_4_;
  auVar6._8_4_ = auVar4._8_4_ + auVar3._8_4_;
  auVar6._12_4_ = auVar4._12_4_ + auVar3._12_4_;
  auVar3 = vdivps_avx(auVar6,auVar5);
  uVar1 = vmovlps_avx(auVar3);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 8) = uVar1;
  __return_storage_ptr__->m_elements[0xb] = -1.0;
  __return_storage_ptr__->m_elements[10] =
       (float)((uint)directX * (int)fZFar + (uint)!directX * (int)(fZNear + fZFar)) /
       (fZNear - fZFar);
  __return_storage_ptr__->m_elements[0xe] =
       ((float)((uint)directX * (int)fZNear + (uint)!directX * (int)fVar2) * fZFar) /
       (fZNear - fZFar);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fLeft, float fRight,
										 float fBottom, float fTop,
										 float fZNear, float fZFar,
										 bool directX )
{
	Matrix4f projection; // zero matrix

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	if( directX )
	{
		projection( 2, 2 ) = fZFar / ( fZNear - fZFar);
		projection( 2, 3 ) = ( fZNear * fZFar ) / ( fZNear - fZFar );
	}
	else
	{
		projection( 2, 2 ) = ( fZNear + fZFar ) / ( fZNear - fZFar );
		projection( 2, 3 ) = ( 2.0f * fZNear * fZFar ) / ( fZNear - fZFar );
	}

	return projection;
}